

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_type_pattern(lysp_ctx *ctx,lysp_stmt *stmt,lysp_restr **patterns)

{
  ly_stmt lVar1;
  LY_ERR LVar2;
  lysp_restr *str_p;
  size_t __n;
  char *pcVar3;
  ly_ctx *local_b0;
  ly_ctx *local_a8;
  ly_ctx *local_98;
  ly_ctx *local_90;
  ly_ctx *local_88;
  ly_ctx *local_80;
  LY_ERR ret___7;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  lysp_stmt *child;
  undefined8 *puStack_50;
  LY_ERR ret___1;
  char *p__;
  LY_ERR ret__;
  lysp_restr *restr;
  size_t arg_len;
  char *buf;
  lysp_restr **patterns_local;
  lysp_stmt *stmt_local;
  lysp_ctx *ctx_local;
  
  ctx_local._4_4_ = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
  if (ctx_local._4_4_ == LY_SUCCESS) {
    if (*patterns == (lysp_restr *)0x0) {
      puStack_50 = (undefined8 *)malloc(0x48);
      if (puStack_50 == (undefined8 *)0x0) {
        if (ctx == (lysp_ctx *)0x0) {
          local_88 = (ly_ctx *)0x0;
        }
        else {
          local_88 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        ly_log(local_88,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_type_pattern"
              );
        return LY_EMEM;
      }
      *puStack_50 = 1;
    }
    else {
      (*patterns)[-1].exts = (lysp_ext_instance *)((long)&((*patterns)[-1].exts)->name + 1);
      puStack_50 = (undefined8 *)
                   realloc(&(*patterns)[-1].exts,(long)(*patterns)[-1].exts * 0x40 + 8);
      if (puStack_50 == (undefined8 *)0x0) {
        (*patterns)[-1].exts = (lysp_ext_instance *)((long)&(*patterns)[-1].exts[-1].exts + 7);
        if (ctx == (lysp_ctx *)0x0) {
          local_80 = (ly_ctx *)0x0;
        }
        else {
          local_80 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        ly_log(local_80,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_type_pattern"
              );
        return LY_EMEM;
      }
    }
    *patterns = (lysp_restr *)(puStack_50 + 1);
    str_p = *patterns + (long)((long)&(*patterns)[-1].exts[-1].exts + 7);
    memset(str_p,0,0x40);
    __n = strlen(stmt->arg);
    pcVar3 = (char *)malloc(__n + 2);
    if (pcVar3 == (char *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        local_90 = (ly_ctx *)0x0;
      }
      else {
        local_90 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(local_90,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_type_pattern");
      ctx_local._4_4_ = LY_EMEM;
    }
    else {
      memmove(pcVar3 + 1,stmt->arg,__n);
      *pcVar3 = '\x06';
      pcVar3[__n + 1] = '\0';
      if (ctx == (lysp_ctx *)0x0) {
        local_98 = (ly_ctx *)0x0;
      }
      else {
        local_98 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ctx_local._4_4_ = lydict_insert_zc(local_98,pcVar3,(char **)str_p);
      if (ctx_local._4_4_ == LY_SUCCESS) {
        (str_p->arg).mod =
             (lysp_module *)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        for (_ret___3 = stmt->child; _ret___3 != (lysp_stmt *)0x0; _ret___3 = _ret___3->next) {
          lVar1 = _ret___3->kw;
          if (lVar1 == LY_STMT_DESCRIPTION) {
            LVar2 = lysp_stmt_text_field(ctx,_ret___3,0,&str_p->dsc,Y_STR_ARG,&str_p->exts);
          }
          else if (lVar1 == LY_STMT_ERROR_APP_TAG) {
            LVar2 = lysp_stmt_text_field(ctx,_ret___3,0,&str_p->eapptag,Y_STR_ARG,&str_p->exts);
          }
          else if (lVar1 == LY_STMT_ERROR_MESSAGE) {
            LVar2 = lysp_stmt_text_field(ctx,_ret___3,0,&str_p->emsg,Y_STR_ARG,&str_p->exts);
          }
          else if (lVar1 == LY_STMT_EXTENSION_INSTANCE) {
            LVar2 = lysp_stmt_ext(ctx,_ret___3,LY_STMT_PATTERN,0,&str_p->exts);
          }
          else if (lVar1 == LY_STMT_MODIFIER) {
            if (*(byte *)&(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1][2].schema
                < 2) {
              if (ctx == (lysp_ctx *)0x0) {
                local_a8 = (ly_ctx *)0x0;
              }
              else {
                local_a8 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              ly_vlog(local_a8,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                      ,"modifier","pattern");
              return LY_EVALID;
            }
            LVar2 = lysp_stmt_type_pattern_modifier(ctx,_ret___3,(char **)str_p,&str_p->exts);
          }
          else {
            if (lVar1 != LY_STMT_REFERENCE) {
              if (ctx == (lysp_ctx *)0x0) {
                local_b0 = (ly_ctx *)0x0;
              }
              else {
                local_b0 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar3 = lyplg_ext_stmt2str(_ret___3->kw);
              ly_vlog(local_b0,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\" as a child of \"%s\".",pcVar3,"pattern");
              return LY_EVALID;
            }
            LVar2 = lysp_stmt_text_field(ctx,_ret___3,0,&str_p->ref,Y_STR_ARG,&str_p->exts);
          }
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
        }
        ctx_local._4_4_ = LY_SUCCESS;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lysp_stmt_type_pattern(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_restr **patterns)
{
    char *buf;
    size_t arg_len;
    struct lysp_restr *restr;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));
    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *patterns, restr, LY_EMEM);
    arg_len = strlen(stmt->arg);

    /* add special meaning first byte */
    buf = malloc(arg_len + 2);
    LY_CHECK_ERR_RET(!buf, LOGMEM(PARSER_CTX(ctx)), LY_EMEM);
    memmove(buf + 1, stmt->arg, arg_len);
    buf[0] = LYSP_RESTR_PATTERN_ACK; /* pattern's default regular-match flag */
    buf[arg_len + 1] = '\0'; /* terminating NULL byte */
    LY_CHECK_RET(lydict_insert_zc(PARSER_CTX(ctx), buf, &restr->arg.str));
    restr->arg.mod = PARSER_CUR_PMOD(ctx);

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &restr->dsc, Y_STR_ARG, &restr->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &restr->ref, Y_STR_ARG, &restr->exts));
            break;
        case LY_STMT_ERROR_APP_TAG:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &restr->eapptag, Y_STR_ARG, &restr->exts));
            break;
        case LY_STMT_ERROR_MESSAGE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &restr->emsg, Y_STR_ARG, &restr->exts));
            break;
        case LY_STMT_MODIFIER:
            PARSER_CHECK_STMTVER2_RET(ctx, "modifier", "pattern");
            LY_CHECK_RET(lysp_stmt_type_pattern_modifier(ctx, child, &restr->arg.str, &restr->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_PATTERN, 0, &restr->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "pattern");
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;
}